

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_json.hpp
# Opt level: O2

type __thiscall
jsoncons::
decode_json<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (jsoncons *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last,basic_json_decode_options<char> *options)

{
  ser_error *this_00;
  error_category *peVar1;
  void *__buf;
  undefined8 extraout_RDX;
  int __fd;
  type tVar2;
  error_code ec;
  allocator<char> local_231;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_local;
  iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  basic_json_reader<char,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<char>_>
  reader;
  iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *source;
  
  last_local = last;
  first_local = first;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder(&decoder,(allocator_type *)&reader,(temp_allocator_type *)&local_220);
  iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_source(&local_220,&first_local,&last_local,0x4000);
  source = &local_220;
  basic_json_reader<char,jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::allocator<char>>
  ::
  basic_json_reader<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
            ((basic_json_reader<char,jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::allocator<char>>
              *)&reader,source,&decoder.super_basic_json_visitor<char>,options,&local_231);
  __fd = (int)source;
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&local_220.buffer_.super__Vector_base<char,_std::allocator<char>_>);
  basic_json_reader<char,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<char>_>
  ::read(&reader,__fd,__buf,(size_t)options);
  if (decoder.is_valid_ != false) {
    json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
    ::get_result((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                  *)this);
    basic_json_reader<char,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<char>_>
    ::~basic_json_reader(&reader);
    json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
    ::~json_decoder(&decoder);
    tVar2.field_0.int64_.val_ = extraout_RDX;
    tVar2.field_0._0_8_ = this;
    return (type)tVar2.field_0;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  peVar1 = conv_error_category();
  ec._M_cat = peVar1;
  ec._0_8_ = 1;
  ser_error::ser_error
            (this_00,ec,reader.parser_.line_,
             (reader.parser_.position_ - reader.parser_.mark_position_) + 1);
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,T>::type
    decode_json(InputIt first, InputIt last,
                const basic_json_decode_options<typename std::iterator_traits<InputIt>::value_type>& options = 
                    basic_json_decode_options<typename std::iterator_traits<InputIt>::value_type>())
    {
        using char_type = typename std::iterator_traits<InputIt>::value_type;

        jsoncons::json_decoder<T> decoder;
        basic_json_reader<char_type, iterator_source<InputIt>> reader(iterator_source<InputIt>(first,last), decoder, options);
        reader.read();
        if (!decoder.is_valid())
        {
            JSONCONS_THROW(ser_error(conv_errc::conversion_failed, reader.line(), reader.column()));
        }
        return decoder.get_result();
    }